

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O0

ostream * operator<<(ostream *os,R2Rect *r)

{
  ostream *poVar1;
  D local_38;
  D local_28;
  R2Rect *local_18;
  R2Rect *r_local;
  ostream *os_local;
  
  local_18 = r;
  r_local = (R2Rect *)os;
  poVar1 = std::operator<<(os,"[Lo");
  local_28.c_ = (VType  [2])R2Rect::lo(local_18);
  poVar1 = util::math::internal_vector::operator<<(poVar1,&local_28);
  poVar1 = std::operator<<(poVar1,", Hi");
  local_38.c_ = (VType  [2])R2Rect::hi(local_18);
  poVar1 = util::math::internal_vector::operator<<(poVar1,&local_38);
  poVar1 = std::operator<<(poVar1,"]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const R2Rect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}